

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

int __thiscall
booster::locale::impl_posix::collator<char>::do_compare
          (collator<char> *this,char_type *lb,char_type *le,char_type *rb,char_type *re)

{
  size_t sVar1;
  uint uVar2;
  string_type left;
  string_type right;
  
  left._M_dataplus._M_p = (pointer)&left.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&left);
  right._M_dataplus._M_p = (pointer)&right.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&right,rb,re);
  sVar1 = coll_traits<char>::coll
                    (left._M_dataplus._M_p,right._M_dataplus._M_p,
                     *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  uVar2 = 0xffffffff;
  if (-1 < (int)sVar1) {
    uVar2 = (uint)((int)sVar1 != 0);
  }
  std::__cxx11::string::~string((string *)&right);
  std::__cxx11::string::~string((string *)&left);
  return uVar2;
}

Assistant:

virtual int do_compare(char_type const *lb,char_type const *le,char_type const *rb,char_type const *re) const
    {
        string_type left(lb,le-lb);
        string_type right(rb,re-rb);
        int res = coll_traits<char_type>::coll(left.c_str(),right.c_str(),*lc_);
        if(res < 0)
            return -1;
        if(res > 0)
            return 1;
        return 0;
    }